

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O2

void __thiscall ParserTest_Directive_Test::TestBody(ParserTest_Directive_Test *this)

{
  char *in_RDX;
  char *s;
  char *s_00;
  char *pcVar1;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  string local_28;
  
  (anonymous_namespace)::Parse_abi_cxx11_(&local_28,(_anonymous_namespace_ *)".. test::",in_RDX);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"<test />\"","Parse(\".. test::\")",(char (*) [9])"<test />",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x9a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  (anonymous_namespace)::Parse_abi_cxx11_(&local_28,(_anonymous_namespace_ *)"..  test::",s);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"<test />\"","Parse(\"..  test::\")",(char (*) [9])"<test />",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x9b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  (anonymous_namespace)::Parse_abi_cxx11_(&local_28,(_anonymous_namespace_ *)"..\ttest::",s_00);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"<test />\"","Parse(\"..\\ttest::\")",(char (*) [9])"<test />",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x9c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ParserTest, Directive) {
  EXPECT_EQ("<test />", Parse(".. test::"));
  EXPECT_EQ("<test />", Parse("..  test::"));
  EXPECT_EQ("<test />", Parse("..\ttest::"));
}